

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O0

TypeNames * __thiscall
wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>::getNames
          (TypeNames *__return_storage_ptr__,
          ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> *this,HeapType type)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_28;
  const_iterator it;
  ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)this;
  this_local = (ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
       ::find(&this->wasm->typeNames,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
       ::end(&this->wasm->typeNames);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                         *)&local_28);
    TypeNames::TypeNames(__return_storage_ptr__,&pvVar2->second);
  }
  else {
    ::wasm::DefaultTypeNameGenerator::getNames((HeapType)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
    if (auto it = wasm.typeNames.find(type); it != wasm.typeNames.end()) {
      return it->second;
    }
    return fallback.getNames(type);
  }